

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_tuple_primitive_byteSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  byte bVar1;
  size_t slotIndex;
  
  if (argumentCount != 2) {
    context = (sysbvm_context_t *)0x2;
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  slotIndex = arguments[1] >> 4;
  if ((arguments[1] & 0xf) == 0) {
    slotIndex = 0;
  }
  bVar1 = sysbvm_tuple_byteSlotAt(context,*arguments,slotIndex);
  return (ulong)bVar1 << 4 | 3;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_byteSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    return sysbvm_tuple_uint8_encode(sysbvm_tuple_byteSlotAt(context, arguments[0], sysbvm_tuple_anySize_decode(arguments[1])));
}